

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O3

void melee_effect_handler_EAT_FOOD(melee_effect_handler_context_t *context)

{
  object *obj;
  _Bool _Var1;
  char cVar2;
  uint32_t uVar3;
  int iVar4;
  char *fmt;
  bool bVar5;
  _Bool none_left;
  object *eaten;
  char o_name [80];
  _Bool local_81;
  object *local_80;
  char local_78 [80];
  
  _Var1 = monster_damage_target(context,true);
  if (!_Var1) {
    iVar4 = 10;
    do {
      uVar3 = Rand_div((uint)z_info->pack_size);
      local_81 = false;
      obj = context->p->upkeep->inven[(int)uVar3];
      if ((obj != (object *)0x0) && (_Var1 = tval_is_edible(obj), _Var1)) {
        bVar5 = obj->number != '\x01';
        fmt = "One of your %s (%c) was eaten!";
        if (!bVar5) {
          fmt = "Your %s (%c) was eaten!";
        }
        object_desc(local_78,0x50,obj,(uint)bVar5 << 6,context->p);
        cVar2 = gear_to_label(context->p,obj);
        msg(fmt,local_78,(ulong)(uint)(int)cVar2);
        local_80 = gear_object_for_use(context->p,obj,L'\x01',false,&local_81);
        if (local_80->known != (object *)0x0) {
          object_delete((chunk *)player->cave,(chunk *)0x0,&local_80->known);
        }
        object_delete((chunk *)cave,(chunk *)player->cave,&local_80);
        context->obvious = true;
        return;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

static void melee_effect_handler_EAT_FOOD(melee_effect_handler_context_t *context)
{
	int tries;

	/* Take damage */
	if (monster_damage_target(context, true)) return;

	/* Steal some food */
	for (tries = 0; tries < 10; tries++) {
		/* Pick an item from the pack */
		int index = randint0(z_info->pack_size);
		struct object *obj, *eaten;
		char o_name[80];
		bool none_left = false;

		/* Get the item */
		obj = context->p->upkeep->inven[index];

		/* Skip non-objects */
		if (obj == NULL) continue;

		/* Skip non-food objects */
		if (!tval_is_edible(obj)) continue;

		if (obj->number == 1) {
			object_desc(o_name, sizeof(o_name), obj, ODESC_BASE,
				context->p);
			msg("Your %s (%c) was eaten!", o_name,
				gear_to_label(context->p, obj));
		} else {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_BASE, context->p);
			msg("One of your %s (%c) was eaten!", o_name,
				gear_to_label(context->p, obj));
		}

		/* Steal and eat */
		eaten = gear_object_for_use(context->p, obj, 1, false,
			&none_left);
		if (eaten->known)
			object_delete(player->cave, NULL, &eaten->known);
		object_delete(cave, player->cave, &eaten);

		/* Obvious */
		context->obvious = true;

		/* Done */
		break;
	}
}